

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O3

bool __thiscall
MT32Emu::MidiStreamParserImpl::checkStreamBufferCapacity
          (MidiStreamParserImpl *this,bool preserveContent)

{
  uint uVar1;
  Bit8u *__src;
  Bit8u *__dest;
  bool bVar2;
  
  uVar1 = this->streamBufferSize;
  bVar2 = true;
  if (this->streamBufferCapacity <= uVar1) {
    if (this->streamBufferCapacity < 0x8000) {
      __src = this->streamBuffer;
      this->streamBufferCapacity = 0x8000;
      __dest = (Bit8u *)operator_new__(0x8000);
      this->streamBuffer = __dest;
      if (preserveContent) {
        memcpy(__dest,__src,(ulong)uVar1);
      }
      if (__src != (Bit8u *)0x0) {
        operator_delete__(__src);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool MidiStreamParserImpl::checkStreamBufferCapacity(const bool preserveContent) {
	if (streamBufferSize < streamBufferCapacity) return true;
	if (streamBufferCapacity < MAX_STREAM_BUFFER_SIZE) {
		Bit8u *oldStreamBuffer = streamBuffer;
		streamBufferCapacity = MAX_STREAM_BUFFER_SIZE;
		streamBuffer = new Bit8u[streamBufferCapacity];
		if (preserveContent) memcpy(streamBuffer, oldStreamBuffer, streamBufferSize);
		delete[] oldStreamBuffer;
		return true;
	}
	return false;
}